

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::BitstringAggFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  LogicalType *type;
  pointer type_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,"bitstring_agg",(allocator *)&local_50);
  AggregateFunctionSet::AggregateFunctionSet(in_RDI,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  LogicalType::Integral();
  for (type_00 = local_50.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      type_00 !=
      local_50.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish; type_00 = type_00 + 1) {
    GetBitStringAggregate(type_00,in_RDI);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  return in_RDI;
}

Assistant:

AggregateFunctionSet BitstringAggFun::GetFunctions() {
	AggregateFunctionSet bitstring_agg("bitstring_agg");
	for (auto &type : LogicalType::Integral()) {
		GetBitStringAggregate(type, bitstring_agg);
	}
	return bitstring_agg;
}